

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall
CNode::ReceiveMsgBytes(CNode *this,Span<const_unsigned_char> msg_bytes,bool *complete)

{
  mapMsgTypeSize *this_00;
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_Transport_*,_false> _Var2;
  char cVar3;
  int iVar4;
  time_point tVar5;
  mapped_type_conflict5 *pmVar6;
  iterator iVar7;
  size_t sVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  bool reject_message;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock36;
  CNetMessage msg;
  char local_a9;
  uchar *local_a8;
  size_t local_a0;
  unique_lock<std::mutex> local_98;
  CNetMessage local_88;
  long local_38;
  
  sVar8 = msg_bytes.m_size;
  local_a8 = msg_bytes.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *complete = false;
  local_a0 = sVar8;
  tVar5 = NodeClock::now();
  local_98._M_device = &(this->cs_vRecv).super_mutex;
  local_98._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_98);
  LOCK();
  (this->m_last_recv)._M_i.__r = (long)tVar5.__d.__r / 1000000000;
  UNLOCK();
  this->nRecvBytes = this->nRecvBytes + sVar8;
  if (sVar8 == 0) {
    cVar3 = '\x01';
  }
  else {
    this_00 = &this->mapRecvBytesPerMsgType;
    p_Var1 = &(this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header;
    do {
      _Var2._M_head_impl =
           (this->m_transport)._M_t.
           super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
           super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
           super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
      iVar4 = (*(_Var2._M_head_impl)->_vptr_Transport[4])(_Var2._M_head_impl,&local_a8);
      cVar3 = (char)iVar4;
      if (cVar3 == '\0') break;
      iVar4 = (*((this->m_transport)._M_t.
                 super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
                 super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
                 super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[3])();
      if ((char)iVar4 != '\0') {
        local_a9 = '\0';
        _Var2._M_head_impl =
             (this->m_transport)._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
        (*(_Var2._M_head_impl)->_vptr_Transport[5])
                  (&local_88,_Var2._M_head_impl,(long)tVar5.__d.__r / 1000,&local_a9);
        if (local_a9 == '\x01') {
          uVar9 = (ulong)local_88.m_raw_message_size;
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::at(this_00,&NET_MESSAGE_TYPE_OTHER_abi_cxx11_);
          *pmVar6 = *pmVar6 + uVar9;
        }
        else {
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::find(&this_00->_M_t,&local_88.m_type);
          if ((_Rb_tree_header *)iVar7._M_node == p_Var1) {
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::find(&this_00->_M_t,&NET_MESSAGE_TYPE_OTHER_abi_cxx11_);
          }
          if ((_Rb_tree_header *)iVar7._M_node == p_Var1) {
            __assert_fail("i != mapRecvBytesPerMsgType.end()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                          ,0x2a9,"bool CNode::ReceiveMsgBytes(Span<const uint8_t>, bool &)");
          }
          *(ulong *)(iVar7._M_node + 2) =
               *(long *)(iVar7._M_node + 2) + (ulong)local_88.m_raw_message_size;
          std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::_M_insert<CNetMessage>
                    (&this->vRecvMsg,(iterator)&this->vRecvMsg,&local_88);
          *complete = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.m_type._M_dataplus._M_p != &local_88.m_type.field_2) {
          operator_delete(local_88.m_type._M_dataplus._M_p,
                          local_88.m_type.field_2._M_allocated_capacity + 1);
        }
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_88);
      }
    } while (local_a0 != 0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)cVar3;
}

Assistant:

bool CNode::ReceiveMsgBytes(Span<const uint8_t> msg_bytes, bool& complete)
{
    complete = false;
    const auto time = GetTime<std::chrono::microseconds>();
    LOCK(cs_vRecv);
    m_last_recv = std::chrono::duration_cast<std::chrono::seconds>(time);
    nRecvBytes += msg_bytes.size();
    while (msg_bytes.size() > 0) {
        // absorb network data
        if (!m_transport->ReceivedBytes(msg_bytes)) {
            // Serious transport problem, disconnect from the peer.
            return false;
        }

        if (m_transport->ReceivedMessageComplete()) {
            // decompose a transport agnostic CNetMessage from the deserializer
            bool reject_message{false};
            CNetMessage msg = m_transport->GetReceivedMessage(time, reject_message);
            if (reject_message) {
                // Message deserialization failed. Drop the message but don't disconnect the peer.
                // store the size of the corrupt message
                mapRecvBytesPerMsgType.at(NET_MESSAGE_TYPE_OTHER) += msg.m_raw_message_size;
                continue;
            }

            // Store received bytes per message type.
            // To prevent a memory DOS, only allow known message types.
            auto i = mapRecvBytesPerMsgType.find(msg.m_type);
            if (i == mapRecvBytesPerMsgType.end()) {
                i = mapRecvBytesPerMsgType.find(NET_MESSAGE_TYPE_OTHER);
            }
            assert(i != mapRecvBytesPerMsgType.end());
            i->second += msg.m_raw_message_size;

            // push the message to the process queue,
            vRecvMsg.push_back(std::move(msg));

            complete = true;
        }
    }

    return true;
}